

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O0

void __thiscall
CTestGen9Resource_TestCubeTileYsResource_Test::TestBody
          (CTestGen9Resource_TestCubeTileYsResource_Test *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t ExpectedValue;
  uint uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  char *pcVar5;
  AssertHelper local_348;
  Message local_340;
  uint local_334;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_7;
  Message local_318;
  uint local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_6;
  Message local_2f0;
  uint local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_5;
  Message local_2c8;
  uint local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_4;
  GMM_REQ_OFFSET_INFO OffsetInfo_1;
  uint32_t CubeFaceIndex_1;
  uint32_t ExpectedQPitch_1;
  uint32_t ExpectedPitch_1;
  GMM_RESOURCE_INFO *ResourceInfo_1;
  TEST_BPP bpp_1;
  uint32_t i_1;
  Message local_220;
  uint local_214;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_3;
  Message local_1f8;
  uint local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  uint local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_1;
  Message local_1a8 [3];
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  GMM_REQ_OFFSET_INFO OffsetInfo;
  uint32_t CubeFaceIndex;
  uint32_t ExpectedQPitch;
  uint32_t ExpectedPitch;
  GMM_RESOURCE_INFO *ResourceInfo;
  TEST_BPP bpp;
  uint32_t i;
  GMM_RESCREATE_PARAMS gmmParams;
  uint32_t TileSize [5] [2];
  uint32_t VAlign [5];
  uint32_t HAlign [5];
  CTestGen9Resource_TestCubeTileYsResource_Test *this_local;
  
  HAlign[0] = 0x80;
  HAlign[1] = 0x80;
  HAlign[2] = 0x40;
  VAlign[0] = 0x80;
  VAlign[1] = 0x40;
  VAlign[2] = 0x40;
  unique0x10001203 = this;
  memcpy(&gmmParams.MultiTileArch,&DAT_0022bb10,0x28);
  memset(&bpp,0,0x80);
  bpp = TEST_BPP_128;
  gmmParams.ExistingSysMemSize._4_1_ = 1;
  gmmParams.Flags.Gpu =
       (anon_struct_8_45_9b07292e_for_Gpu)
       ((ulong)gmmParams.Flags.Gpu & 0xffffffafffffffff | 0x5000000000);
  gmmParams._0_8_ = gmmParams._0_8_ & 0xfffffffbffffffff | 0x400000000;
  for (ResourceInfo._4_4_ = TEST_BPP_8; ResourceInfo._4_4_ < TEST_BPP_MAX;
      ResourceInfo._4_4_ = ResourceInfo._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo._4_4_);
    gmmParams.CpTag = 1;
    gmmParams._44_4_ = 0;
    gmmParams.field_6.BaseWidth = 1;
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,HAlign[(ulong)ResourceInfo._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,VAlign[(ulong)ResourceInfo._4_4_ - 2]);
    uVar2 = TileSize[(ulong)ResourceInfo._4_4_ - 1][0];
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,1);
    uVar3 = VAlign[(ulong)ResourceInfo._4_4_ - 2];
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar4,(ulong)uVar3);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,(ulong)(uVar2 * 6 * uVar3))
    ;
    for (OffsetInfo.StdLayout.TileDepthPitch._4_4_ = 0;
        OffsetInfo.StdLayout.TileDepthPitch._4_4_ < 6;
        OffsetInfo.StdLayout.TileDepthPitch._4_4_ = OffsetInfo.StdLayout.TileDepthPitch._4_4_ + 1) {
      OffsetInfo.StdLayout.Offset = 0;
      OffsetInfo.StdLayout.TileRowPitch = 0;
      OffsetInfo.Render.XOffset = 0;
      OffsetInfo.Render.YOffset = 0;
      OffsetInfo.Render.ZOffset = 0;
      OffsetInfo.Render._20_4_ = 0;
      OffsetInfo.Lock.Pitch = 0;
      OffsetInfo.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo.Render.field_0.Offset64 = 0;
      OffsetInfo.Frame = GMM_DISPLAY_BASE;
      OffsetInfo._28_4_ = 0;
      OffsetInfo.Lock.field_0.Offset64 = 0;
      OffsetInfo.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo.Plane = GMM_NO_PLANE;
      OffsetInfo._0_4_ = 0;
      OffsetInfo.ArrayIndex = 0;
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo.Slice = 0;
      OffsetInfo.MipLevel = OffsetInfo.StdLayout.TileDepthPitch._4_4_;
      (**(code **)(*(long *)pGVar4 + 0x68))(pGVar4,&gtest_ar.message_);
      local_18c = OffsetInfo.StdLayout.TileDepthPitch._4_4_ * uVar3 * uVar2;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_188,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",&local_18c,(unsigned_long *)&OffsetInfo.Lock.Pitch);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(local_1a8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc93,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(local_1a8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
      local_1c4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_1c0,"0",(int *)"OffsetInfo.Render.XOffset",&local_1c4,
                 &OffsetInfo.Render);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc94,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
      local_1ec = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_1e8,"0",(int *)"OffsetInfo.Render.YOffset",&local_1ec,
                 (type *)((long)&OffsetInfo.Render.field_0 + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
      if (!bVar1) {
        testing::Message::Message(&local_1f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc95,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
      local_214 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_210,"0",(int *)"OffsetInfo.Render.ZOffset",&local_214,
                 &OffsetInfo.Render.XOffset);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_220);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&bpp_1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xc96,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&bpp_1,&local_220);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&bpp_1);
        testing::Message::~Message(&local_220);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
  }
  for (ResourceInfo_1._4_4_ = TEST_BPP_8; ResourceInfo_1._4_4_ < TEST_BPP_MAX;
      ResourceInfo_1._4_4_ = ResourceInfo_1._4_4_ + TEST_BPP_16) {
    i = CTestResource::SetResourceFormat((CTestResource *)this,ResourceInfo_1._4_4_);
    uVar3 = TileSize[(ulong)ResourceInfo_1._4_4_ - 1][0];
    uVar2 = CTestResource::GetBppValue((CTestResource *)this,ResourceInfo_1._4_4_);
    gmmParams.field_6.BaseWidth = uVar3 / uVar2 + 1;
    gmmParams._40_8_ = ZEXT48(gmmParams.field_6.BaseWidth);
    gmmParams.field_6.BaseWidth64._4_4_ = 1;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&bpp,(ulong)uVar3 % (ulong)uVar2);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,HAlign[(ulong)ResourceInfo_1._4_4_ - 2]);
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,VAlign[(ulong)ResourceInfo_1._4_4_ - 2]);
    uVar2 = TileSize[(ulong)ResourceInfo_1._4_4_ - 1][0];
    ExpectedValue = uVar2 * 2;
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,ExpectedValue);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    uVar3 = (gmmParams.field_6.BaseWidth + (VAlign[(ulong)ResourceInfo_1._4_4_ - 2] - 1)) -
            (gmmParams.field_6.BaseWidth + (VAlign[(ulong)ResourceInfo_1._4_4_ - 2] - 1) &
            VAlign[(ulong)ResourceInfo_1._4_4_ - 2] - 1);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar4,(ulong)uVar3);
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this,pGVar4,(ulong)(uVar2 * 0xc * uVar3));
    for (OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ = 0;
        OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ < 6;
        OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ =
             OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ + 1) {
      OffsetInfo_1.StdLayout.Offset = 0;
      OffsetInfo_1.StdLayout.TileRowPitch = 0;
      OffsetInfo_1.Render.XOffset = 0;
      OffsetInfo_1.Render.YOffset = 0;
      OffsetInfo_1.Render.ZOffset = 0;
      OffsetInfo_1.Render._20_4_ = 0;
      OffsetInfo_1.Lock.Pitch = 0;
      OffsetInfo_1.Lock.field_2 =
           (anon_union_4_2_7f1cee3a_for_anon_struct_16_3_bc420dd9_for_Lock_3)0x0;
      OffsetInfo_1.Render.field_0.Offset64 = 0;
      OffsetInfo_1.Frame = GMM_DISPLAY_BASE;
      OffsetInfo_1._28_4_ = 0;
      OffsetInfo_1.Lock.field_0.Offset64 = 0;
      OffsetInfo_1.CubeFace = __GMM_CUBE_FACE_POS_X;
      OffsetInfo_1.Plane = GMM_NO_PLANE;
      OffsetInfo_1._0_4_ = 0;
      OffsetInfo_1.ArrayIndex = 0;
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      OffsetInfo_1.Slice = 0;
      OffsetInfo_1.MipLevel = OffsetInfo_1.StdLayout.TileDepthPitch._4_4_;
      (**(code **)(*(long *)pGVar4 + 0x68))(pGVar4,&gtest_ar_4.message_);
      local_2bc = OffsetInfo_1.StdLayout.TileDepthPitch._4_4_ * uVar3 * ExpectedValue;
      testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
                ((EqHelper<false> *)local_2b8,"(CubeFaceIndex * ExpectedQPitch) * ExpectedPitch",
                 "OffsetInfo.Render.Offset64",&local_2bc,(unsigned_long *)&OffsetInfo_1.Lock.Pitch);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
      if (!bVar1) {
        testing::Message::Message(&local_2c8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbe,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_2c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
      local_2e4 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_2e0,"0",(int *)"OffsetInfo.Render.XOffset",&local_2e4,
                 &OffsetInfo_1.Render);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
      if (!bVar1) {
        testing::Message::Message(&local_2f0);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcbf,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_2f0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
        testing::Message::~Message(&local_2f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
      local_30c = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_308,"0",(int *)"OffsetInfo.Render.YOffset",&local_30c,
                 (type *)((long)&OffsetInfo_1.Render.field_0 + 4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
      if (!bVar1) {
        testing::Message::Message(&local_318);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc0,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_318);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
        testing::Message::~Message(&local_318);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
      local_334 = 0;
      testing::internal::EqHelper<true>::Compare<int,unsigned_int>
                ((char *)local_330,"0",(int *)"OffsetInfo.Render.ZOffset",&local_334,
                 &OffsetInfo_1.Render.XOffset);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
      if (!bVar1) {
        testing::Message::Message(&local_340);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
        testing::internal::AssertHelper::AssertHelper
                  (&local_348,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen9ResourceULT.cpp"
                   ,0xcc1,pcVar5);
        testing::internal::AssertHelper::operator=(&local_348,&local_340);
        testing::internal::AssertHelper::~AssertHelper(&local_348);
        testing::Message::~Message(&local_340);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
    }
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, TestCubeTileYsResource)
{
    // Cube is allocated as an array of 6 2D surface representing each cube face below
    //===============================
    // �q� coordinate  |    face    |
    //      0          |    + x     |
    //      1          |    - x     |
    //      2          |    + y     |
    //      3          |    - y     |
    //      4          |    + z     |
    //      5          |    - z     |
    //===============================

    const uint32_t HAlign[TEST_BPP_MAX] = {256, 256, 128, 128, 64};
    const uint32_t VAlign[TEST_BPP_MAX] = {256, 128, 128, 64, 64};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{256, 256},
                                                {512, 128},
                                                {512, 128},
                                                {1024, 64},
                                                {1024, 64}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_CUBE;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYs   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1 surface so that it occupies 1 Tile in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0];
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch); // As wide as 1 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);      // 1 tile wide

        uint32_t ExpectedQPitch = VAlign[i];
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be VAlign rows apart within a tile

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);

            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension.
    // Width and Height must be equal
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = gmmParams.BaseWidth64;                   // Heigth must be equal to width.
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);

        uint32_t ExpectedPitch = TileSize[i][0] * 2; // As wide as 2 tile
        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2); // 2 tile wide

        uint32_t ExpectedQPitch = GMM_ULT_ALIGN(gmmParams.BaseHeight, VAlign[i]);
        VerifyResourceQPitch<true>(ResourceInfo, ExpectedQPitch); // Each face should be Valigned-BaseHeight rows apart

        VerifyResourceSize<true>(ResourceInfo, // PitchInBytes * Rows where Rows = __GMM_MAX_CUBE_FACE x QPitch, then aligned to tile boundary
                                 ExpectedPitch *
                                 __GMM_MAX_CUBE_FACE * ExpectedQPitch);

        for(uint32_t CubeFaceIndex = 0; CubeFaceIndex < __GMM_MAX_CUBE_FACE; CubeFaceIndex++)
        {
            GMM_REQ_OFFSET_INFO OffsetInfo = {};
            OffsetInfo.ReqRender           = 1;
            OffsetInfo.CubeFace            = static_cast<GMM_CUBE_FACE_ENUM>(CubeFaceIndex);
            ResourceInfo->GetOffset(OffsetInfo);
            EXPECT_EQ((CubeFaceIndex * ExpectedQPitch) * ExpectedPitch,
                      OffsetInfo.Render.Offset64);   // Render offset is tile's base address on which cube face begins.
            EXPECT_EQ(0, OffsetInfo.Render.XOffset); // X Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.YOffset); // Y Offset should be 0 as cube face starts on tile boundary
            EXPECT_EQ(0, OffsetInfo.Render.ZOffset); // Z offset N/A should be 0
        }

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}